

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  U32 lastNonNull;
  void *__s;
  nodeElt *huffNode_00;
  int nonNullRank;
  nodeElt *huffNode;
  nodeElt *huffNode0;
  HUF_buildCTable_wksp_tables *wksp_tables;
  size_t wkspSize_local;
  void *workSpace_local;
  U32 maxNbBits_local;
  U32 maxSymbolValue_local;
  uint *count_local;
  HUF_CElt *CTable_local;
  
  wksp_tables = (HUF_buildCTable_wksp_tables *)wkspSize;
  wkspSize_local = (size_t)workSpace;
  workSpace_local._0_4_ = maxNbBits;
  workSpace_local._4_4_ = maxSymbolValue;
  _maxNbBits_local = count;
  count_local = (uint *)CTable;
  __s = HUF_alignUpWorkspace(workSpace,(size_t *)&wksp_tables,4);
  huffNode_00 = (nodeElt *)((long)__s + 8);
  if (wksp_tables < (HUF_buildCTable_wksp_tables *)0x1300) {
    CTable_local = (HUF_CElt *)0xffffffffffffffbe;
  }
  else {
    if ((U32)workSpace_local == 0) {
      workSpace_local._0_4_ = 0xb;
    }
    if (workSpace_local._4_4_ < 0x100) {
      memset(__s,0,0x1000);
      HUF_sort(huffNode_00,_maxNbBits_local,workSpace_local._4_4_,(rankPos *)((long)__s + 0x1000));
      lastNonNull = HUF_buildTree(huffNode_00,workSpace_local._4_4_);
      workSpace_local._0_4_ = HUF_setMaxHeight(huffNode_00,lastNonNull,(U32)workSpace_local);
      if ((U32)workSpace_local < 0xd) {
        HUF_buildCTableFromTree
                  ((HUF_CElt *)count_local,huffNode_00,lastNonNull,workSpace_local._4_4_,
                   (U32)workSpace_local);
        CTable_local = (HUF_CElt *)(ulong)(U32)workSpace_local;
      }
      else {
        CTable_local = (HUF_CElt *)0xffffffffffffffff;
      }
    }
    else {
      CTable_local = (HUF_CElt *)0xffffffffffffffd2;
    }
  }
  return (size_t)CTable_local;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}